

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecCast(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  unique_ptr<enact::CastExpr,_std::default_delete<enact::CastExpr>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> typename_;
  Token oper;
  Parser *this_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *expr;
  
  parsePrecRange(this);
  bVar1 = consume(in_RSI,AS);
  if ((bVar1) || (bVar1 = consume(in_RSI,IS), bVar1)) {
    Token::Token((Token *)&typename_,&in_RSI->m_previous);
    std::operator+(&local_a8,"Expected typename after \'",&(in_RSI->m_previous).lexeme);
    std::operator+(&local_88,&local_a8,"\'.");
    expectTypename((Parser *)local_68,(string *)in_RSI,SUB81(&local_88,0));
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::
    make_unique<enact::CastExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,enact::Token>
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&local_b0,
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               this,(Token *)local_68);
    std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::operator=
              ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,&local_b0);
    std::unique_ptr<enact::CastExpr,_std::default_delete<enact::CastExpr>_>::~unique_ptr(&local_b0);
    std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
              ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               local_68);
    Token::~Token((Token *)&typename_);
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecCast() {
        std::unique_ptr<Expr> expr = parsePrecRange();

        if (consume(TokenType::AS) || consume(TokenType::IS)) {
            Token oper = m_previous;
            std::unique_ptr<const Typename> typename_ = expectTypename(
                    "Expected typename after '" + m_previous.lexeme + "'.");
            expr = std::make_unique<CastExpr>(std::move(expr), std::move(typename_), std::move(oper));
        }

        return expr;
    }